

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O0

void __thiscall mod_verify::ModVerifyTest1<int>::ModVerifyTest1(ModVerifyTest1<int> *this)

{
  ostream *poVar1;
  undefined8 in_RDI;
  SafeIntException *anon_var_0_1;
  int r_1;
  SafeIntException *anon_var_0;
  int r;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> m;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  bool divzero;
  bool expected;
  size_t shift;
  size_t width;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined8 in_stack_fffffffffffffe50;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [40];
  int local_b8;
  int local_b4;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [56];
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_28;
  int local_24;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_20;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_10;
  int t;
  
  t = (int)((ulong)in_RDI >> 0x20);
  local_10 = 4;
  local_18 = 0x1f;
  local_19 = 1;
  local_24 = -0x80000000;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_20,&local_24);
  local_2c = 0;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_28,&local_2c);
  local_38 = local_28.m_int;
  local_34 = (int)SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  ::operator%((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                               *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                               )(int)in_stack_fffffffffffffe50);
  rhs.m_int = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  local_30 = SafeInt::operator_cast_to_int(in_stack_fffffffffffffe40);
  local_1a = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<int>();
  poVar1 = std::operator<<(poVar1,local_70);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_70);
  SafeInt::operator_cast_to_int(in_stack_fffffffffffffe40);
  to_hex<int>(t);
  poVar1 = std::operator<<((ostream *)&std::cerr,local_90);
  poVar1 = std::operator<<(poVar1,", ");
  SafeInt::operator_cast_to_int(in_stack_fffffffffffffe40);
  to_hex<int>(t);
  poVar1 = std::operator<<(poVar1,local_b0);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_b4 = SafeInt::operator_cast_to_int(in_stack_fffffffffffffe40);
  local_b8 = local_28.m_int;
  operator%=((int *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),rhs);
  local_1a = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<int>();
  poVar1 = std::operator<<(poVar1,local_e0);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_e0);
  SafeInt::operator_cast_to_int(in_stack_fffffffffffffe40);
  to_hex<int>(t);
  poVar1 = std::operator<<((ostream *)&std::cerr,local_100);
  poVar1 = std::operator<<(poVar1,", ");
  SafeInt::operator_cast_to_int(in_stack_fffffffffffffe40);
  to_hex<int>(t);
  poVar1 = std::operator<<(poVar1,local_120);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_100);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

ModVerifyTest1<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;
		const bool expected = true;

		bool divzero;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m(0);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}
	}